

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleARGBRowDownEven_SSE2
               (uint8_t *src_argb,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_argb,int dst_width
               )

{
  uint8_t *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  intptr_t src_stepx_x12;
  intptr_t src_stepx_x4;
  int dst_width_local;
  uint8_t *dst_argb_local;
  int src_stepx_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_argb_local;
  
  lVar6 = (long)src_stepx;
  do {
    uVar2 = *(undefined4 *)src_argb;
    puVar1 = src_argb + lVar6 * 4;
    uVar3 = *(undefined4 *)(src_argb + lVar6 * 8);
    uVar4 = *(undefined4 *)(src_argb + lVar6 * 0xc);
    src_argb = src_argb + lVar6 * 0x10;
    *(ulong *)dst_argb = CONCAT44(*(undefined4 *)puVar1,uVar2);
    *(ulong *)(dst_argb + 8) = CONCAT44(uVar4,uVar3);
    dst_argb = dst_argb + 0x10;
    iVar7 = dst_width + -4;
    bVar5 = 3 < dst_width;
    dst_width = iVar7;
  } while (iVar7 != 0 && bVar5);
  return;
}

Assistant:

void ScaleARGBRowDownEven_SSE2(const uint8_t* src_argb,
                               ptrdiff_t src_stride,
                               int src_stepx,
                               uint8_t* dst_argb,
                               int dst_width) {
  intptr_t src_stepx_x4 = (intptr_t)(src_stepx);
  intptr_t src_stepx_x12;
  (void)src_stride;
  asm volatile(
      "lea         0x00(,%1,4),%1                \n"
      "lea         0x00(%1,%1,2),%4              \n"

      LABELALIGN
      "1:                                        \n"
      "movd        (%0),%%xmm0                   \n"
      "movd        0x00(%0,%1,1),%%xmm1          \n"
      "punpckldq   %%xmm1,%%xmm0                 \n"
      "movd        0x00(%0,%1,2),%%xmm2          \n"
      "movd        0x00(%0,%4,1),%%xmm3          \n"
      "lea         0x00(%0,%1,4),%0              \n"
      "punpckldq   %%xmm3,%%xmm2                 \n"
      "punpcklqdq  %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%3                       \n"
      "jg          1b                            \n"
      : "+r"(src_argb),       // %0
        "+r"(src_stepx_x4),   // %1
        "+r"(dst_argb),       // %2
        "+r"(dst_width),      // %3
        "=&r"(src_stepx_x12)  // %4
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm2", "xmm3");
}